

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O2

bool __thiscall
PruneReplayer::enqueue_create_compute_pipeline
          (PruneReplayer *this,Hash hash,VkComputePipelineCreateInfo *create_info,
          VkPipeline *pipeline)

{
  bool bVar1;
  Hash hash_local;
  VkShaderModule local_18;
  
  *pipeline = (VkPipeline)hash;
  hash_local = hash;
  bVar1 = filter_object(this,RESOURCE_COMPUTE_PIPELINE,hash);
  if (bVar1) {
    bVar1 = filter_shader_module(this,(Hash)(create_info->stage).module);
    if (bVar1) {
      access_pipeline_layout(this,(Hash)create_info->layout);
      local_18 = (create_info->stage).module;
      std::__detail::
      _Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert((_Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                *)&this->accessed_shader_modules,(value_type *)&local_18);
      std::__detail::
      _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&this->accessed_compute_pipelines,&hash_local);
    }
  }
  return true;
}

Assistant:

bool enqueue_create_compute_pipeline(Hash hash, const VkComputePipelineCreateInfo *create_info, VkPipeline *pipeline) override
	{
		*pipeline = fake_handle<VkPipeline>(hash);

		if (filter_object(RESOURCE_COMPUTE_PIPELINE, hash))
		{
			bool allow_pipeline = filter_shader_module((Hash)create_info->stage.module);

			if (allow_pipeline)
			{
				access_pipeline_layout((Hash) create_info->layout);
				accessed_shader_modules.insert((Hash) create_info->stage.module);
				accessed_compute_pipelines.insert(hash);
			}
		}
		return true;
	}